

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darLib.c
# Opt level: O1

Dar_Lib_t * Dar_LibAlloc(int nObjs)

{
  ulong *puVar1;
  Dar_Lib_t *__s;
  Dar_LibObj_t *__s_00;
  char **ppcVar2;
  long lVar3;
  
  __s = (Dar_Lib_t *)malloc(0x3f18);
  lVar3 = 0;
  memset(__s,0,0x3f18);
  __s->nObjs = nObjs;
  __s_00 = (Dar_LibObj_t *)malloc((long)nObjs << 3);
  __s->pObjs = __s_00;
  memset(__s_00,0,(long)nObjs << 3);
  ppcVar2 = Dar_Permutations(4);
  __s->pPerms4 = ppcVar2;
  Dar_Truth4VarNPN(&__s->puCanons,&__s->pPhases,&__s->pPerms,&__s->pMap);
  __s->iObj = 4;
  do {
    puVar1 = (ulong *)(&__s->pObjs->field_0x0 + lVar3 * 2);
    *puVar1 = *puVar1 | 0x800000000;
    *(ulong *)(&__s->pObjs->field_0x0 + lVar3 * 2) =
         *(ulong *)(&__s->pObjs->field_0x0 + lVar3 * 2) & 0xfffffffff |
         (ulong)*(uint *)((long)&Saig_ManBmcCof1_s_Truth + lVar3) << 0x24;
    lVar3 = lVar3 + 4;
  } while (lVar3 != 0x10);
  return __s;
}

Assistant:

Dar_Lib_t * Dar_LibAlloc( int nObjs )
{
    unsigned uTruths[4] = { 0xAAAA, 0xCCCC, 0xF0F0, 0xFF00 };
    Dar_Lib_t * p;
    int i;//, clk = Abc_Clock();
    p = ABC_ALLOC( Dar_Lib_t, 1 );
    memset( p, 0, sizeof(Dar_Lib_t) );
    // allocate objects
    p->nObjs = nObjs;
    p->pObjs = ABC_ALLOC( Dar_LibObj_t, nObjs );
    memset( p->pObjs, 0, sizeof(Dar_LibObj_t) * nObjs );
    // allocate canonical data
    p->pPerms4 = Dar_Permutations( 4 );
    Dar_Truth4VarNPN( &p->puCanons, &p->pPhases, &p->pPerms, &p->pMap );
    // start the elementary objects
    p->iObj = 4;
    for ( i = 0; i < 4; i++ )
    {
        p->pObjs[i].fTerm = 1;
        p->pObjs[i].Num = uTruths[i];
    }
//    ABC_PRT( "Library start", Abc_Clock() - clk );
    return p;
}